

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

char16 * Js::VariableWalkerBase::ParseFunctionName
                   (char16 *displayNameBuffer,charcount_t displayNameBufferLength,
                   ScriptContext *scriptContext)

{
  int iVar1;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar2;
  TrackAllocData local_70;
  char16_t *local_48;
  char16 *actualFunctionNameBuffer;
  uint byteLengthForCopy;
  charcount_t actualFunctionNameLength;
  char16 *parenChar;
  charcount_t templateStringLength;
  charcount_t funcStringLength;
  ScriptContext *scriptContext_local;
  char16 *pcStack_18;
  charcount_t displayNameBufferLength_local;
  char16 *displayNameBuffer_local;
  
  parenChar._4_4_ = 9;
  parenChar._0_4_ = 0x1d;
  pcStack_18 = displayNameBuffer;
  if ((displayNameBufferLength < 0x1e) ||
     (_templateStringLength = scriptContext, scriptContext_local._4_4_ = displayNameBufferLength,
     iVar1 = PAL_wmemcmp(displayNameBuffer,L"function ",9), iVar1 != 0)) {
    return pcStack_18;
  }
  _byteLengthForCopy = PAL_wcschr(pcStack_18,L'(');
  if (_byteLengthForCopy == (char16_t *)0x0) {
    return pcStack_18;
  }
  actualFunctionNameBuffer._4_4_ = scriptContext_local._4_4_ - 0x1d;
  actualFunctionNameBuffer._0_4_ = actualFunctionNameBuffer._4_4_ * 2;
  pAVar2 = &GetArenaFromContext(_templateStringLength)->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_70,(type_info *)&char16_t::typeinfo,0,
             (ulong)(actualFunctionNameBuffer._4_4_ + 1),
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
             ,0x111);
  pAVar2 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar2,&local_70);
  local_48 = Memory::AllocateArray<Memory::ArenaAllocator,char16_t,false>
                       ((Memory *)pAVar2,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                        (ulong)(actualFunctionNameBuffer._4_4_ + 1));
  if (local_48 == (char16_t *)0x0) {
    return pcStack_18;
  }
  js_memcpy_s(local_48,(ulong)(uint)actualFunctionNameBuffer,pcStack_18 + 9,
              (ulong)(uint)actualFunctionNameBuffer);
  local_48[actualFunctionNameBuffer._4_4_] = L'\0';
  return local_48;
}

Assistant:

const char16 * VariableWalkerBase::ParseFunctionName(const char16 * displayNameBuffer, const charcount_t displayNameBufferLength, ScriptContext* scriptContext)
    {
        const charcount_t funcStringLength = _countof(JS_DISPLAY_STRING_FUNCTION_HEADER) - 1; // discount the ending null character in string literal
        const charcount_t templateStringLength = funcStringLength + _countof(JS_DISPLAY_STRING_FUNCTION_BODY) - 1; // discount the ending null character in string literal
        // If the string doesn't meet our expected format; return the original string.
        if (displayNameBufferLength <= templateStringLength || (wmemcmp(displayNameBuffer, JS_DISPLAY_STRING_FUNCTION_HEADER, funcStringLength) != 0))
        {
            return displayNameBuffer;
        }

        // Look for the left parenthesis, if we don't find one; return the original string.
        const char16* parenChar = wcschr(displayNameBuffer, '(');
        if (parenChar == nullptr)
        {
            return displayNameBuffer;
        }

        charcount_t actualFunctionNameLength = displayNameBufferLength - templateStringLength;
        uint byteLengthForCopy = sizeof(char16) * actualFunctionNameLength;
        char16 * actualFunctionNameBuffer = AnewArray(GetArenaFromContext(scriptContext), char16, actualFunctionNameLength + 1); // The last character will be the null character.
        if (actualFunctionNameBuffer == nullptr)
        {
            return displayNameBuffer;
        }
        js_memcpy_s(actualFunctionNameBuffer, byteLengthForCopy, displayNameBuffer + funcStringLength, byteLengthForCopy);
        actualFunctionNameBuffer[actualFunctionNameLength] = _u('\0');

        return actualFunctionNameBuffer;
    }